

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer_type.cpp
# Opt level: O3

OptimizerType duckdb::OptimizerTypeFromString(string *str)

{
  pointer pcVar1;
  int iVar2;
  ParserException *this;
  long lVar3;
  long lVar4;
  undefined1 *puVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  optimizer_names;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  iVar2 = ::std::__cxx11::string::compare((char *)str);
  if (iVar2 == 0) {
    puVar5 = internal_optimizer_types;
  }
  else {
    lVar4 = 0;
    do {
      lVar3 = lVar4;
      lVar4 = lVar3 + 0x10;
      if (lVar4 == 0x1b0) {
        local_a8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_a8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_a8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar4 = 0;
        do {
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*const&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_a8,
                     (char **)(internal_optimizer_types + lVar4));
          lVar4 = lVar4 + 0x10;
        } while (lVar4 != 0x1b0);
        this = (ParserException *)__cxa_allocate_exception(0x10);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c8,"Optimizer type \"%s\" not recognized\n%s","");
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        pcVar1 = (str->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,pcVar1,pcVar1 + str->_M_string_length);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_90,"Candidate optimizers","");
        StringUtil::CandidatesErrorMessage(&local_50,&local_a8,(string *)str,&local_90,5);
        ParserException::ParserException<std::__cxx11::string,std::__cxx11::string>
                  (this,&local_c8,&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50);
        __cxa_throw(this,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar2 = ::std::__cxx11::string::compare((char *)str);
    } while (iVar2 != 0);
    puVar5 = (undefined1 *)(lVar3 + 0x244c7d0);
  }
  return *(OptimizerType *)(puVar5 + 8);
}

Assistant:

OptimizerType OptimizerTypeFromString(const string &str) {
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		if (internal_optimizer_types[i].name == str) {
			return internal_optimizer_types[i].type;
		}
	}
	// optimizer not found, construct candidate list
	vector<string> optimizer_names;
	for (idx_t i = 0; internal_optimizer_types[i].name; i++) {
		optimizer_names.emplace_back(internal_optimizer_types[i].name);
	}
	throw ParserException("Optimizer type \"%s\" not recognized\n%s", str,
	                      StringUtil::CandidatesErrorMessage(optimizer_names, str, "Candidate optimizers"));
}